

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_block_grid_ptr(Integer g_a,Integer *index,void *ptr,Integer *ld)

{
  global_array_t *pgVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  global_array_t *pgVar6;
  global_array_t *pgVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Integer *pIVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  C_Integer *pCVar15;
  long lVar16;
  ulong uVar17;
  C_Integer *pCVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  Integer *pIVar22;
  C_Integer CVar23;
  long lVar24;
  C_Integer *pCVar25;
  bool bVar26;
  Integer proc_index [7];
  Integer lld [7];
  Integer ldims [7];
  Integer ldidx [7];
  Integer block_idx [7];
  Integer block_count [7];
  Integer *local_1e0;
  long local_1d8 [8];
  Integer *local_198;
  global_array_t *local_190;
  undefined8 *local_188;
  C_Integer *local_180;
  C_Integer *local_178;
  long local_170;
  long alStack_168 [8];
  long alStack_128 [8];
  long alStack_e8 [8];
  long alStack_a8 [8];
  long alStack_68 [7];
  
  local_188 = (undefined8 *)ptr;
  lVar20 = g_a + 1000;
  pIVar11 = index;
  if (2 < GA[g_a + 1000].distr_type - 2U) {
    pIVar11 = (Integer *)0x0;
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  pgVar6 = GA;
  sVar2 = GA[lVar20].ndim;
  uVar21 = (ulong)sVar2;
  local_1e0 = ld;
  if (0 < (long)uVar21) {
    uVar9 = 0;
    do {
      pIVar11 = (Integer *)index[uVar9];
      if (((long)pIVar11 < 0) || (pgVar6[lVar20].num_blocks[uVar9] <= (long)pIVar11)) {
        pnga_error("block index outside allowed values",(Integer)pIVar11);
      }
      uVar9 = uVar9 + 1;
    } while (uVar21 != uVar9);
  }
  pgVar7 = GA;
  pCVar25 = pgVar6[lVar20].block_dims;
  pgVar1 = GA + lVar20;
  iVar4 = GA[lVar20].distr_type;
  local_190 = pgVar1;
  if (iVar4 == 2) {
    uVar3 = pgVar1->ndim;
    uVar10 = (uint)(short)uVar3;
    pIVar11 = (Integer *)(ulong)uVar10;
    if ((short)uVar3 < 1) {
      pIVar22 = (&local_1e0)[(int)uVar10];
LAB_0017ab8d:
      local_1d8[0] = (long)pIVar22 % (long)pgVar1->nblock[0];
    }
    else {
      uVar9 = 0;
      do {
        local_1d8[uVar9] = index[uVar9] % (long)GA[g_a + 1000].nblock[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      pIVar22 = (&local_1e0)[(int)uVar10];
      if (uVar3 == 1) goto LAB_0017ab8d;
      uVar9 = (ulong)(uVar10 - 2);
      do {
        pIVar22 = (Integer *)((long)pIVar22 * (long)GA[g_a + 1000].nblock[uVar9] + local_1d8[uVar9])
        ;
        bVar26 = uVar9 != 0;
        uVar9 = uVar9 - 1;
      } while (bVar26);
      lVar12 = (long)pgVar1->nblock[0];
      local_1d8[0] = (long)pIVar22 % lVar12;
      if (uVar3 != 1) {
        lVar8 = 0;
        pIVar11 = pIVar22;
        do {
          pIVar11 = (Integer *)(((long)pIVar11 - local_1d8[0]) / (long)(int)lVar12);
          lVar12 = (long)GA[g_a + 1000].nblock[lVar8 + 1];
          local_1d8[0] = (long)pIVar11 % lVar12;
          local_1d8[lVar8 + 1] = local_1d8[0];
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar3 - 1 != lVar8);
      }
    }
    if (1 < sVar2) {
      lVar12 = 0;
      do {
        lVar8 = pgVar6[g_a + 1000].block_dims[lVar12];
        lVar19 = pgVar6[g_a + 1000].nblock[lVar12] * lVar8;
        lVar13 = pgVar7[g_a + 1000].dims[lVar12];
        lVar24 = lVar13 % lVar19;
        pIVar11 = (Integer *)((lVar13 / lVar19) * lVar8);
        local_1e0[lVar12] = (Integer)pIVar11;
        lVar13 = pgVar6[g_a + 1000].block_dims[lVar12];
        lVar19 = pgVar6[g_a + 1000].dims[lVar12];
        if (lVar24 < 1) {
LAB_0017ac3b:
          lVar13 = lVar19 % lVar13;
        }
        else if (lVar24 / lVar8 <= local_1d8[lVar12]) {
          lVar19 = lVar24;
          if (local_1d8[lVar12] == lVar24 / lVar8) goto LAB_0017ac3b;
          lVar13 = 0;
        }
        local_1e0[lVar12] = lVar13 + (long)pIVar11;
        lVar12 = lVar12 + 1;
      } while (uVar21 - 1 != lVar12);
    }
  }
  else if (iVar4 == 4) {
    uVar3 = pgVar1->ndim;
    uVar10 = (uint)(short)uVar3;
    if ((short)uVar3 < 1) {
      pIVar22 = (&local_1e0)[(int)uVar10];
LAB_0017aa10:
      local_1d8[0] = (long)pIVar22 % (long)pgVar1->nblock[0];
    }
    else {
      uVar9 = 0;
      do {
        local_1d8[uVar9] = index[uVar9] % (long)GA[g_a + 1000].nblock[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      pIVar22 = (&local_1e0)[(int)uVar10];
      if (uVar3 == 1) goto LAB_0017aa10;
      uVar9 = (ulong)(uVar10 - 2);
      do {
        pIVar22 = (Integer *)((long)pIVar22 * (long)GA[g_a + 1000].nblock[uVar9] + local_1d8[uVar9])
        ;
        bVar26 = uVar9 != 0;
        uVar9 = uVar9 - 1;
      } while (bVar26);
      lVar12 = (long)pgVar1->nblock[0];
      local_1d8[0] = (long)pIVar22 % lVar12;
      if (uVar3 != 1) {
        lVar8 = 0;
        pIVar11 = pIVar22;
        do {
          pIVar11 = (Integer *)(((long)pIVar11 - local_1d8[0]) / (long)(int)lVar12);
          lVar12 = (long)GA[g_a + 1000].nblock[lVar8 + 1];
          local_1d8[0] = (long)pIVar11 % lVar12;
          local_1d8[lVar8 + 1] = local_1d8[0];
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar3 - 1 != lVar8);
      }
    }
    if (sVar2 < 1) {
      pIVar11 = (Integer *)0x0;
    }
    else {
      local_198 = pIVar22;
      lVar12 = uVar21 - 1;
      pCVar15 = GA[lVar20].mapc;
      local_180 = pCVar15 + 1;
      uVar9 = 0;
      pIVar11 = (Integer *)0x0;
      local_170 = lVar12;
      local_178 = pCVar15;
      do {
        alStack_168[uVar9] = 0;
        alStack_e8[uVar9] = 0;
        lVar8 = index[uVar9];
        lVar13 = pgVar6[lVar20].num_blocks[uVar9];
        if (lVar8 < lVar13 + -1) {
          CVar23 = pCVar15[(long)pIVar11 + lVar8 + 1] + -1;
        }
        else {
          CVar23 = pgVar6[lVar20].dims[uVar9];
        }
        lVar24 = (CVar23 - pCVar15[(long)pIVar11 + lVar8]) + 1;
        alStack_128[uVar9] = lVar24;
        lVar19 = local_1d8[uVar9];
        if (lVar19 < lVar13) {
          iVar4 = pgVar6[lVar20].nblock[uVar9];
          lVar12 = 0;
          lVar16 = 0;
          do {
            if (lVar19 < lVar13 + -1) {
              CVar23 = local_180[(long)pIVar11 + lVar19] + -1;
            }
            else {
              CVar23 = pgVar6[lVar20].dims[uVar9];
            }
            lVar5 = local_180[(long)pIVar11 + lVar19 + -1];
            if (lVar19 < lVar8) {
              lVar12 = lVar12 + (CVar23 - lVar5) + 1;
              alStack_e8[uVar9] = lVar12;
            }
            lVar16 = lVar16 + (CVar23 - lVar5) + 1;
            lVar19 = lVar19 + iVar4;
          } while (lVar19 < lVar13);
          alStack_168[uVar9] = lVar16;
          lVar12 = local_170;
          pCVar15 = local_178;
        }
        if ((long)uVar9 < lVar12) {
          local_1e0[uVar9] = lVar24;
          lVar13 = pgVar6[lVar20].num_blocks[uVar9];
        }
        pIVar11 = (Integer *)((long)pIVar11 + lVar13);
        uVar9 = uVar9 + 1;
        pIVar22 = local_198;
      } while (uVar9 != uVar21);
    }
  }
  else {
    pIVar22 = index;
    if (iVar4 == 3) {
      uVar3 = pgVar1->ndim;
      uVar10 = (uint)(short)uVar3;
      pIVar11 = (Integer *)(ulong)uVar10;
      if ((short)uVar3 < 1) {
        pIVar22 = (&local_1e0)[(int)uVar10];
LAB_0017ac6d:
        pIVar11 = (Integer *)(long)pgVar1->nblock[0];
        local_1d8[0] = (long)pIVar22 % (long)pIVar11;
      }
      else {
        uVar9 = 0;
        do {
          local_1d8[uVar9] = index[uVar9] % (long)GA[g_a + 1000].nblock[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        pIVar22 = (&local_1e0)[(int)uVar10];
        if (uVar3 == 1) goto LAB_0017ac6d;
        uVar9 = (ulong)(uVar10 - 2);
        do {
          pIVar22 = (Integer *)
                    ((long)pIVar22 * (long)GA[g_a + 1000].nblock[uVar9] + local_1d8[uVar9]);
          bVar26 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar26);
        lVar12 = (long)pgVar1->nblock[0];
        local_1d8[0] = (long)pIVar22 % lVar12;
        if (uVar3 != 1) {
          lVar8 = 0;
          pIVar11 = pIVar22;
          do {
            pIVar11 = (Integer *)(((long)pIVar11 - local_1d8[0]) / (long)(int)lVar12);
            lVar12 = (long)GA[g_a + 1000].nblock[lVar8 + 1];
            local_1d8[0] = (long)pIVar11 % lVar12;
            local_1d8[lVar8 + 1] = local_1d8[0];
            lVar8 = lVar8 + 1;
          } while ((ulong)uVar3 - 1 != lVar8);
        }
      }
      if (0 < sVar2) {
        uVar9 = 0;
        do {
          lVar12 = (index[uVar9] + 1) * pCVar25[uVar9];
          if (pgVar6[lVar20].dims[uVar9] <= lVar12) {
            lVar12 = pgVar6[lVar20].dims[uVar9];
          }
          pIVar11 = (Integer *)(lVar12 - pCVar25[uVar9] * index[uVar9]);
          alStack_128[uVar9] = (long)pIVar11;
          if ((long)uVar9 < (long)(uVar21 - 1)) {
            local_1e0[uVar9] = (Integer)pIVar11;
          }
          uVar9 = uVar9 + 1;
        } while (uVar21 != uVar9);
      }
    }
  }
  iVar4 = pgVar7[lVar20].distr_type;
  if (iVar4 == 4) {
    if (0 < sVar2) {
      uVar9 = 0;
      pIVar11 = (Integer *)0x0;
      do {
        lVar20 = 1;
        if (uVar9 != 0) {
          uVar17 = 0;
          do {
            lVar20 = lVar20 * alStack_168[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
        }
        lVar20 = lVar20 * alStack_e8[uVar9];
        uVar9 = uVar9 + 1;
        for (uVar17 = uVar9; (long)uVar17 < (long)uVar21; uVar17 = uVar17 + 1) {
          lVar20 = lVar20 * alStack_128[uVar17];
        }
        pIVar11 = (Integer *)((long)pIVar11 + lVar20);
      } while (uVar9 != uVar21);
      goto LAB_0017af08;
    }
  }
  else if (iVar4 == 3) {
    if (0 < sVar2) {
      uVar9 = 0;
      do {
        lVar13 = (long)pgVar6[g_a + 1000].nblock[uVar9];
        alStack_a8[uVar9] = ((index[uVar9] - local_1d8[uVar9]) + 1) / lVar13;
        lVar20 = pgVar6[g_a + 1000].block_dims[uVar9];
        lVar12 = (pgVar6[g_a + 1000].num_blocks[uVar9] - local_1d8[uVar9]) + 1;
        lVar8 = lVar12 / lVar13;
        if (lVar12 % lVar13 == 0) {
          lVar12 = pgVar6[g_a + 1000].dims[uVar9] % lVar20;
          lVar8 = lVar8 << 0x20;
          lVar13 = lVar8 >> 0x20;
          if (lVar12 == 0) goto LAB_0017adcc;
          alStack_168[uVar9] = lVar20 * (lVar8 + -0x100000000 >> 0x20) + lVar12;
        }
        else {
          lVar13 = (long)(int)lVar8;
LAB_0017adcc:
          alStack_168[uVar9] = lVar20 * lVar13;
        }
        alStack_68[uVar9] = lVar13;
        uVar9 = uVar9 + 1;
      } while (uVar21 != uVar9);
      if (0 < sVar2) {
        uVar9 = 0;
        pIVar11 = (Integer *)0x0;
        do {
          lVar20 = 1;
          pCVar15 = pCVar25;
          uVar17 = uVar9;
          if (uVar9 != 0) {
            uVar14 = 0;
            do {
              lVar20 = lVar20 * alStack_168[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar9 != uVar14);
          }
          do {
            pCVar18 = pCVar15;
            if ((uVar9 < uVar17) && (alStack_a8[uVar17] == alStack_68[uVar17] + -1)) {
              pCVar18 = alStack_128 + uVar17;
            }
            lVar20 = lVar20 * *pCVar18;
            uVar17 = uVar17 + 1;
            pCVar15 = pCVar15 + 1;
          } while ((long)uVar17 < (long)uVar21);
          pIVar11 = (Integer *)((long)pIVar11 + lVar20 * alStack_a8[uVar9]);
          uVar9 = uVar9 + 1;
          pCVar25 = pCVar25 + 1;
        } while (uVar9 != uVar21);
        goto LAB_0017af08;
      }
    }
  }
  else {
    if (iVar4 != 2) goto LAB_0017af08;
    if (0 < sVar2) {
      uVar9 = 0;
      pIVar11 = (Integer *)0x0;
      lVar20 = 1;
      do {
        lVar12 = lVar20;
        if ((long)uVar9 < (long)(uVar21 - 1)) {
          lVar12 = local_1e0[uVar9] * lVar20;
        }
        pIVar11 = (Integer *)
                  ((long)pIVar11 +
                  ((index[uVar9] - local_1d8[uVar9]) / (long)pgVar6[g_a + 1000].nblock[uVar9]) *
                  lVar20 * pgVar6[g_a + 1000].block_dims[uVar9]);
        uVar9 = uVar9 + 1;
        lVar20 = lVar12;
      } while (uVar21 != uVar9);
      goto LAB_0017af08;
    }
  }
  pIVar11 = (Integer *)0x0;
LAB_0017af08:
  *local_188 = local_190->ptr[(long)pIVar22] + (long)local_190->elemsize * (long)pIVar11;
  return;
}

Assistant:

void pnga_access_block_grid_ptr(Integer g_a, Integer *index, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * index: subscript of a particular block  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i/*, p_handle*/, offset, factor, inode;
  Integer ndim;
  C_Integer *num_blocks, *block_dims;
  int *proc_grid;
  Integer *dims;
  Integer last;
  Integer proc_index[MAXDIM];
  Integer blk_num[MAXDIM], blk_dim[MAXDIM], blk_inc[MAXDIM];
  Integer blk_ld[MAXDIM],hlf_blk[MAXDIM],blk_jinc;
  Integer j, lo, hi;
  Integer lld[MAXDIM], block_idx[MAXDIM], block_count[MAXDIM];
  Integer ldims[MAXDIM], ldidx[MAXDIM];
  Integer *mapc;

  
  /*p_handle = GA[handle].p_handle;*/
  if (GA[handle].distr_type != SCALAPACK && GA[handle].distr_type != TILED &&
      GA[handle].distr_type != TILED_IRREG) {
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  /* dimensions of processor grid */
  proc_grid = GA[handle].nblock;
  /* number of blocks along each dimension */
  num_blocks = GA[handle].num_blocks;
  /* size of individual blocks */
  block_dims = GA[handle].block_dims;
  dims = GA[handle].dims;
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    if (index[i] < 0 || index[i] >= num_blocks[i])
      pnga_error("block index outside allowed values",index[i]);
  }

  /* Find strides of requested block */
  if (GA[handle].distr_type == TILED) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index)

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    for (i=0; i<ndim; i++)  {
      lo = index[i]*block_dims[i]+1;
      hi = (index[i]+1)*block_dims[i];
      if (hi > dims[i]) hi = dims[i]; 
      ldims[i] = (hi - lo + 1);
      if (i<last) ld[i] = ldims[i];
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    mapc = GA[handle].mapc;
    offset = 0;
    for (i=0; i<ndim; i++) {
      lld[i] = 0;
      ldidx[i] = 0;
      lo = mapc[offset+index[i]];
      if (index[i] < num_blocks[i]-1) {
        hi = mapc[offset+index[i]+1]-1;
      } else {
        hi = dims[i];
      }
      ldims[i] = hi - lo + 1;
      for (j = proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = mapc[offset+j];
        if (j < num_blocks[i]-1) {
          hi = mapc[offset+j+1]-1;
        } else {
          hi = dims[i];
        }
        lld[i] += (hi-lo+1);
        if (j < index[i]) {
          ldidx[i] += (hi-lo+1);
        }
      }
      if (i<last) ld[i] = ldims[i];
      offset += num_blocks[i];
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* find out what processor block is located on */
    gam_find_proc_from_sl_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_proc_indices(handle,inode,proc_index)
      last = ndim-1;
 
    for (i=0; i<last; i++)  {
      blk_dim[i] = block_dims[i]*proc_grid[i];
      blk_num[i] = GA[handle].dims[i]/blk_dim[i];
      blk_inc[i] = GA[handle].dims[i] - blk_num[i]*blk_dim[i];
      blk_ld[i] = blk_num[i]*block_dims[i];
      hlf_blk[i] = blk_inc[i]/block_dims[i];
      ld[i] = blk_ld[i];
      blk_jinc = dims[i]%block_dims[i];
      if (blk_inc[i] > 0) {
        if (proc_index[i]<hlf_blk[i]) {
          blk_jinc = block_dims[i];
        } else if (proc_index[i] == hlf_blk[i]) {
          blk_jinc = blk_inc[i]%block_dims[i];
          /*
          if (blk_jinc == 0) {
          blk_jinc = block_dims[i];
          }
          */
        } else {
          blk_jinc = 0;
        }
      }
      ld[i] += blk_jinc;
    }
  }

  /* Find the local grid index of block relative to local block grid and
     store result in block_idx.
     Find physical dimensions of locally held data and store in 
     lld and set values in ldim, which is used to evaluate the
     offset for the requested block. */
  if (GA[handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      int ldim;
      /*
      block_idx[i] = 0;
      block_count[i] = 0;
      lld[i] = 0;
      lo = 0;
      hi = -1;
      */
      block_idx[i] = (index[i]-proc_index[i]+1)/proc_grid[i];
      ldim = (num_blocks[i]-proc_index[i]+1)/proc_grid[i];
      if ((num_blocks[i]-proc_index[i]+1)%proc_grid[i] == 0) {
        if (dims[i]%block_dims[i] != 0) {
          lld[i] = (ldim-1)*block_dims[i] + dims[i]%block_dims[i];
        } else {
          lld[i] = ldim*block_dims[i];
        }
      } else {
        lld[i] = ldim *block_dims[i];
      }
      block_count[i] = ldim;
      /*
      for (j=proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = j*block_dims[i] + 1;
        hi = (j+1)*block_dims[i];
        if (hi > dims[i]) hi = dims[i]; 
        lld[i] += (hi - lo + 1);
        if (j<index[i]) block_idx[i]++;
        block_count[i]++;
      }
      */
    }

    /* Evaluate offset for requested block. The algorithm used goes like this:
     *    The contribution from the fastest dimension is
     *      block_idx[0]*block_dims[0]*...*block_dims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      block_idx[1]*lld[0]*block_dims[1]*...*block_dims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      block_idx[2]*lld[0]*lld[1]*block_dims[2]*...*block_dims[ndim-1];
     *    etc.
     *    If block_idx[i] is equal to the total number of blocks contained on that
     *    processor minus 1 (the index is at the edge of the array) and the index
     *    i is greater than the index of the dimension, then instead of using the
     *    block dimension, use the fractional dimension of the edge block (which
     *    may be smaller than the block dimension)
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      for (j=i; j<ndim; j++) {
        if (j > i && block_idx[j] == block_count[j]-1) {
          factor *= ldims[j];
        } else {
          factor *= block_dims[j];
        }
      }
      offset += block_idx[i]*factor;
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Evaluate offset for requested block. This algorithm is similar to the
     * algorithm for reqularly tiled data layouts.
     *    The contribution from the fastest dimension is
     *      ldidx[0]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      lld[0]*ldidx[1]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      lld[0]*lld[1]*ldidx[2]*ldims[3]*...*ldims[ndim-1];
     *    etc.
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      factor *= ldidx[i];
      for (j=i+1; j<ndim; j++) {
        factor *= ldims[j];
      }
      offset += factor;
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* Evalauate offset for block */
    offset = 0;
    factor = 1;
    for (i = 0; i<ndim; i++) {
      offset += ((index[i]-proc_index[i])/proc_grid[i])*block_dims[i]*factor;
      if (i<ndim-1) factor *= ld[i];
    }
  }

  lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

  *(char**)ptr = lptr; 
}